

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O0

void __thiscall Array3dTest_Access_Test::Array3dTest_Access_Test(Array3dTest_Access_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Array3dTest_Access_Test_002b1448;
  return;
}

Assistant:

TEST(Array3dTest, Access)
{
    Array3d<int> a(6, 4, 1, -1);
    for (int i = 0; i < 6; i++)
    for (int j = 0; j < 4; j++)
    for (int k = 0; k < 1; k++)
        a(i, j, k) = i + j + k;
    for (int i = 0; i < 6; i++)
    for (int j = 0; j < 4; j++)
    for (int k = 0; k < 1; k++)
        ASSERT_EQ(i + j + k, a(i, j, k));
}